

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_midistream.cpp
# Opt level: O1

void __thiscall
MIDIStreamer::CreateSMF(MIDIStreamer *this,TArray<unsigned_char,_unsigned_char> *file,int looplimit)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  BYTE *pBVar4;
  int iVar5;
  undefined4 extraout_var;
  uint uVar6;
  long lVar7;
  DWORD (*paDVar8) [384];
  DWORD DVar9;
  DWORD *__src;
  uchar *__dest;
  byte bVar10;
  uint value;
  
  (*(this->super_MusInfo)._vptr_MusInfo[0x16])(this,1);
  iVar5 = 0x1e;
  if (0 < looplimit) {
    iVar5 = looplimit;
  }
  this->LoopLimit = iVar5;
  (*(this->super_MusInfo)._vptr_MusInfo[0x18])(this);
  this->Tempo = this->InitialTempo;
  TArray<unsigned_char,_unsigned_char>::Grow(file,0x1d);
  file->Count = file->Count + 0x1d;
  pBVar4 = file->Array;
  pBVar4[0xd] = '\0';
  pBVar4[0xe] = 'M';
  pBVar4[0xf] = 'T';
  pBVar4[0x10] = 'r';
  pBVar4[0x11] = 'k';
  pBVar4[0x12] = '\0';
  pBVar4[0x13] = '\0';
  pBVar4[0x14] = '\0';
  pBVar4[0x15] = '\0';
  pBVar4[0x16] = '\0';
  pBVar4[0x17] = 0xff;
  pBVar4[0x18] = 'Q';
  pBVar4[0x19] = '\x03';
  pBVar4[0x1a] = '\0';
  pBVar4[0x1b] = '\0';
  pBVar4[0x1c] = '\0';
  builtin_memcpy(pBVar4,"MThd",5);
  pBVar4[5] = '\0';
  pBVar4[6] = '\0';
  pBVar4[7] = '\x06';
  pBVar4[8] = '\0';
  pBVar4[9] = '\0';
  pBVar4[10] = '\0';
  pBVar4[0xb] = '\x01';
  pBVar4[0xc] = '\0';
  pBVar4[0xd] = '\0';
  pBVar4[0xe] = 'M';
  pBVar4[0xf] = 'T';
  file->Array[0xc] = *(uchar *)((long)&this->Division + 1);
  file->Array[0xd] = (uchar)this->Division;
  file->Array[0x1a] = *(uchar *)((long)&this->InitialTempo + 2);
  file->Array[0x1b] = *(uchar *)((long)&this->InitialTempo + 1);
  file->Array[0x1c] = (uchar)this->InitialTempo;
  iVar5 = (*(this->super_MusInfo)._vptr_MusInfo[0x19])(this);
  DVar9 = 0;
  if ((char)iVar5 == '\0') {
    bVar10 = 0xff;
    DVar9 = 0;
    do {
      iVar5 = (*(this->super_MusInfo)._vptr_MusInfo[0x1c])
                        (this,this->Events,this->Events + 1,600000000);
      for (paDVar8 = this->Events; paDVar8 < (undefined1 *)CONCAT44(extraout_var,iVar5);
          paDVar8 = (DWORD (*) [384])((long)*paDVar8 + lVar7)) {
        DVar9 = DVar9 + (*paDVar8)[0];
        uVar6 = (*paDVar8)[2] >> 0x18;
        if (uVar6 == 0x80) {
          WriteVarLen(file,DVar9);
          uVar6 = (*paDVar8)[2] & 0xffffff;
          if ((char)(*paDVar8)[3] == -0x10) {
            value = uVar6 - 1;
            TArray<unsigned_char,_unsigned_char>::Grow(file,1);
            file->Array[file->Count] = 0xf0;
            file->Count = file->Count + 1;
            WriteVarLen(file,value);
            TArray<unsigned_char,_unsigned_char>::Grow(file,value);
            uVar3 = file->Count;
            file->Count = (uVar3 + uVar6) - 1;
            __dest = file->Array + uVar3;
            __src = (DWORD *)((long)*paDVar8 + 0xd);
            uVar6 = value;
          }
          else {
            __src = *paDVar8 + 3;
            TArray<unsigned_char,_unsigned_char>::Grow(file,1);
            file->Array[file->Count] = 0xf7;
            file->Count = file->Count + 1;
            WriteVarLen(file,uVar6);
            TArray<unsigned_char,_unsigned_char>::Grow(file,uVar6);
            uVar3 = file->Count;
            file->Count = uVar3 + uVar6;
            __dest = file->Array + uVar3;
          }
          memcpy(__dest,__src,(ulong)uVar6);
LAB_0033c616:
          DVar9 = 0;
          bVar10 = 0xff;
        }
        else {
          if (uVar6 == 1) {
            WriteVarLen(file,DVar9);
            DVar9 = (*paDVar8)[2];
            TArray<unsigned_char,_unsigned_char>::Grow(file,1);
            file->Array[file->Count] = 0xff;
            file->Count = file->Count + 1;
            TArray<unsigned_char,_unsigned_char>::Grow(file,1);
            file->Array[file->Count] = 'Q';
            file->Count = file->Count + 1;
            TArray<unsigned_char,_unsigned_char>::Grow(file,1);
            file->Array[file->Count] = '\x03';
            file->Count = file->Count + 1;
            TArray<unsigned_char,_unsigned_char>::Grow(file,1);
            file->Array[file->Count] = (uchar)(DVar9 >> 0x10);
            file->Count = file->Count + 1;
            TArray<unsigned_char,_unsigned_char>::Grow(file,1);
            file->Array[file->Count] = (uchar)(DVar9 >> 8);
            file->Count = file->Count + 1;
            TArray<unsigned_char,_unsigned_char>::Grow(file,1);
            file->Array[file->Count] = (uchar)DVar9;
            file->Count = file->Count + 1;
            goto LAB_0033c616;
          }
          if ((*paDVar8)[2] < 0x1000000) {
            WriteVarLen(file,DVar9);
            bVar2 = (byte)(*paDVar8)[2];
            if (bVar10 != bVar2) {
              TArray<unsigned_char,_unsigned_char>::Grow(file,1);
              file->Array[file->Count] = bVar2;
              file->Count = file->Count + 1;
              bVar10 = bVar2;
            }
            bVar1 = *(byte *)((long)*paDVar8 + 9);
            TArray<unsigned_char,_unsigned_char>::Grow(file,1);
            file->Array[file->Count] = bVar1 & 0x7f;
            file->Count = file->Count + 1;
            DVar9 = 0;
            if (MIDI_EventLengths[bVar2 >> 4 & 7] == '\x02') {
              bVar2 = *(byte *)((long)*paDVar8 + 10);
              TArray<unsigned_char,_unsigned_char>::Grow(file,1);
              file->Array[file->Count] = bVar2 & 0x7f;
              file->Count = file->Count + 1;
            }
          }
        }
        lVar7 = (ulong)(((*paDVar8)[2] & 0xffffff) + 3 & 0xfffffffc) + 0xc;
        if (-1 < (int)(*paDVar8)[2]) {
          lVar7 = 0xc;
        }
      }
      iVar5 = (*(this->super_MusInfo)._vptr_MusInfo[0x19])(this);
    } while ((char)iVar5 == '\0');
  }
  WriteVarLen(file,DVar9);
  TArray<unsigned_char,_unsigned_char>::Grow(file,1);
  file->Array[file->Count] = 0xff;
  file->Count = file->Count + 1;
  TArray<unsigned_char,_unsigned_char>::Grow(file,1);
  file->Array[file->Count] = '/';
  file->Count = file->Count + 1;
  TArray<unsigned_char,_unsigned_char>::Grow(file,1);
  file->Array[file->Count] = '\0';
  uVar6 = file->Count;
  file->Count = uVar6 + 1;
  iVar5 = uVar6 - 0x15;
  file->Array[0x12] = (uchar)((uint)iVar5 >> 0x18);
  file->Array[0x13] = (uchar)((uint)iVar5 >> 0x10);
  file->Array[0x14] = (uchar)((uint)iVar5 >> 8);
  file->Array[0x15] = (uchar)iVar5;
  this->LoopLimit = 0;
  return;
}

Assistant:

void MIDIStreamer::CreateSMF(TArray<BYTE> &file, int looplimit)
{
	DWORD delay = 0;
	BYTE running_status = 255;

	// Always create songs aimed at GM devices.
	CheckCaps(MOD_MIDIPORT);
	LoopLimit = looplimit <= 0 ? EXPORT_LOOP_LIMIT : looplimit;
	DoRestart();
	Tempo = InitialTempo;

	file.Reserve(sizeof(StaticMIDIhead));
	memcpy(&file[0], StaticMIDIhead, sizeof(StaticMIDIhead));
	file[12] = Division >> 8;
	file[13] = Division & 0xFF;
	file[26] = InitialTempo >> 16;
	file[27] = InitialTempo >> 8;
	file[28] = InitialTempo;

	while (!CheckDone())
	{
		DWORD *event_end = MakeEvents(Events[0], &Events[0][MAX_EVENTS*3], 1000000*600);
		for (DWORD *event = Events[0]; event < event_end; )
		{
			delay += event[0];
			if (MEVT_EVENTTYPE(event[2]) == MEVT_TEMPO)
			{
				WriteVarLen(file, delay);
				delay = 0;
				DWORD tempo = MEVT_EVENTPARM(event[2]);
				file.Push(MIDI_META);
				file.Push(MIDI_META_TEMPO);
				file.Push(3);
				file.Push(BYTE(tempo >> 16));
				file.Push(BYTE(tempo >> 8));
				file.Push(BYTE(tempo));
				running_status = 255;
			}
			else if (MEVT_EVENTTYPE(event[2]) == MEVT_LONGMSG)
			{
				WriteVarLen(file, delay);
				delay = 0;
				DWORD len = MEVT_EVENTPARM(event[2]);
				BYTE *bytes = (BYTE *)&event[3];
				if (bytes[0] == MIDI_SYSEX)
				{
					len--;
					file.Push(MIDI_SYSEX);
					WriteVarLen(file, len);
					memcpy(&file[file.Reserve(len)], bytes + 1, len);
				}
				else
				{
					file.Push(MIDI_SYSEXEND);
					WriteVarLen(file, len);
					memcpy(&file[file.Reserve(len)], bytes, len);
				}
				running_status = 255;
			}
			else if (MEVT_EVENTTYPE(event[2]) == 0)
			{
				WriteVarLen(file, delay);
				delay = 0;
				BYTE status = BYTE(event[2]);
				if (status != running_status)
				{
					running_status = status;
					file.Push(status);
				}
				file.Push(BYTE((event[2] >> 8) & 0x7F));
				if (MIDI_EventLengths[(status >> 4) & 7] == 2)
				{
					file.Push(BYTE((event[2] >> 16) & 0x7F));
				}
			}
			// Advance to next event
			if (event[2] < 0x80000000)
			{ // short message
				event += 3;
			}
			else
			{ // long message
				event += 3 + ((MEVT_EVENTPARM(event[2]) + 3) >> 2);
			}
		}
	}

	// End track
	WriteVarLen(file, delay);
	file.Push(MIDI_META);
	file.Push(MIDI_META_EOT);
	file.Push(0);

	// Fill in track length
	DWORD len = file.Size() - 22;
	file[18] = BYTE(len >> 24);
	file[19] = BYTE(len >> 16);
	file[20] = BYTE(len >> 8);
	file[21] = BYTE(len & 255);

	LoopLimit = 0;
}